

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::SectionInfo::SectionInfo
          (SectionInfo *this,SourceLineInfo *_lineInfo,string *_name,string *_description)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _name->_M_string_length);
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar1 = (_description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + _description->_M_string_length);
  (this->lineInfo).file._M_dataplus._M_p = (pointer)&(this->lineInfo).file.field_2;
  pcVar1 = (_lineInfo->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lineInfo,pcVar1,pcVar1 + (_lineInfo->file)._M_string_length);
  (this->lineInfo).line = _lineInfo->line;
  return;
}

Assistant:

SectionInfo::SectionInfo
	(SourceLineInfo const& _lineInfo,
		std::string const& _name,
		std::string const& _description)
		: name(_name),
		description(_description),
		lineInfo(_lineInfo)
	{}